

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache.c
# Opt level: O3

int vmemcache_put(VMEMcache *cache,void *key,size_t ksize,void *value,size_t value_size)

{
  byte bVar1;
  int iVar2;
  undefined8 *puVar3;
  ulong uVar4;
  int *piVar5;
  ptr_ext_t *ppVar6;
  ulong uVar7;
  size_t size;
  bool bVar8;
  bool bVar9;
  ptr_ext_t *local_48;
  ptr_ext_t *small_extent;
  size_t local_38;
  
  local_38 = value_size;
  puVar3 = (undefined8 *)__tls_get_addr(&PTR_0010afc0);
  if ((((void *)*puVar3 != (void *)0x0) && (puVar3[1] == ksize)) &&
     (iVar2 = bcmp((void *)*puVar3,key,ksize), iVar2 == 0)) {
    *puVar3 = 0;
    uVar4 = local_38 - puVar3[4];
    if (local_38 < (ulong)puVar3[4] || uVar4 == 0) {
      puVar3[3] = 0;
    }
    else {
      uVar7 = puVar3[3];
      if (uVar4 < (ulong)puVar3[3]) {
        puVar3[3] = uVar4;
        uVar7 = uVar4;
      }
      if ((void *)puVar3[2] != (void *)0x0) {
        memcpy((void *)puVar3[2],value,uVar7);
      }
    }
    if ((ulong *)puVar3[5] != (ulong *)0x0) {
      *(ulong *)puVar3[5] = local_38;
    }
  }
  if (cache->size < local_38) {
    out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/vmemcache.c",
            0x152,"vmemcache_put","value larger than entire cache");
    piVar5 = __errno_location();
    *piVar5 = 0x1c;
  }
  else {
    ppVar6 = (ptr_ext_t *)Zalloc(ksize + 0x28);
    if (ppVar6 == (ptr_ext_t *)0x0) {
      out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/vmemcache.c",
              0x15b,"vmemcache_put","!Zalloc");
    }
    else {
      *(size_t *)(ppVar6 + 0x20) = ksize;
      memcpy(ppVar6 + 0x28,key,ksize);
      bVar1 = cache->field_0x58;
      small_extent = ppVar6;
      if ((bVar1 & 6) == 0) {
        local_48 = (ptr_ext_t *)0x0;
        if (local_38 != 0) {
          size = local_38;
          do {
            uVar4 = vmcache_alloc(cache->heap,size,(ptr_ext_t **)(ppVar6 + 0x18),&local_48);
            if ((long)uVar4 < 0) goto LAB_001048ec;
            if ((uVar4 == 0) && (iVar2 = vmemcache_evict(cache,(void *)0x0,0), iVar2 != 0)) {
              piVar5 = __errno_location();
              if (*piVar5 == 3) {
                *piVar5 = 0x1c;
              }
              goto LAB_001048ec;
            }
            bVar8 = uVar4 <= size;
            size = size - uVar4;
            bVar9 = size != 0;
            if (!bVar8) {
              size = 0;
            }
          } while (bVar8 && bVar9);
          bVar1 = cache->field_0x58;
        }
        if ((bVar1 & 8) == 0) {
          ppVar6 = *(ptr_ext_t **)(small_extent + 0x18);
          uVar4 = vmcache_extent_get_size(ppVar6);
          uVar7 = local_38;
          while (ppVar6 != (ptr_ext_t *)0x0) {
            if (uVar7 <= uVar4) {
              uVar4 = uVar7;
            }
            memcpy(ppVar6,value,uVar4);
            value = (void *)((long)value + uVar4);
            uVar7 = uVar7 - uVar4;
            ppVar6 = vmcache_extent_get_next(ppVar6);
            uVar4 = vmcache_extent_get_size(ppVar6);
          }
        }
        *(size_t *)(small_extent + 0x10) = local_38;
      }
      iVar2 = vmcache_index_insert(cache->index,(cache_entry *)small_extent);
      if (iVar2 == 0) {
        if ((cache->field_0x58 & 2) != 0) {
          return 0;
        }
        (*cache->repl->ops->repl_p_insert)
                  (cache->repl->head,small_extent,(repl_p_entry **)(small_extent + 8));
        return 0;
      }
LAB_001048ec:
      ppVar6 = small_extent;
      vmcache_free(cache->heap,*(ptr_ext_t **)(small_extent + 0x18));
      free(ppVar6);
    }
  }
  return -1;
}

Assistant:

int
vmemcache_put(VMEMcache *cache, const void *key, size_t ksize,
				const void *value, size_t value_size)
{
	LOG(3, "cache %p key %p ksize %zu value %p value_size %zu",
		cache, key, ksize, value, value_size);

	if (get_req.key)
		vmemcache_put_satisfy_get(key, ksize, value, value_size);

	if (value_size > cache->size) {
		ERR("value larger than entire cache");
		errno = ENOSPC;
		return -1;
	}

	struct cache_entry *entry;

	entry = Zalloc(sizeof(struct cache_entry) + ksize);
	if (entry == NULL) {
		ERR("!Zalloc");
		return -1;
	}

	entry->key.ksize = ksize;
	memcpy(entry->key.key, key, ksize);

	if (cache->index_only || cache->no_alloc)
		goto put_index;

	ptr_ext_t *small_extent = NULL; /* required by vmcache_alloc() */
	size_t left_to_allocate = value_size;

	while (left_to_allocate != 0) {
		ssize_t allocated = vmcache_alloc(cache->heap, left_to_allocate,
							&entry->value.extents,
							&small_extent);
		if (allocated < 0)
			goto error_exit;

		if (allocated == 0 && vmemcache_evict(cache, NULL, 0)) {
			LOG(1, "vmemcache_evict() failed");
			if (errno == ESRCH)
				errno = ENOSPC;
			goto error_exit;
		}

		left_to_allocate -= MIN((size_t)allocated, left_to_allocate);
	}

	if (cache->no_memcpy)
		entry->value.vsize = value_size;
	else
		vmemcache_populate_extents(entry, value, value_size);

put_index:
	if (vmcache_index_insert(cache->index, entry)) {
		LOG(1, "inserting to the index failed");
		goto error_exit;
	}

	if (!cache->index_only) {
		cache->repl->ops->repl_p_insert(cache->repl->head, entry,
					&entry->value.p_entry);
	}

	return 0;

error_exit:
	vmcache_free(cache->heap, entry->value.extents);

	Free(entry);

	return -1;
}